

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_crld.cc
# Opt level: O3

void * v2i_crld(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  char *__s1;
  int iVar1;
  OPENSSL_STACK *sk;
  size_t sVar2;
  CONF_VALUE *cnf;
  GENERAL_NAME *a;
  OPENSSL_STACK *pOVar3;
  size_t sVar4;
  ASN1_VALUE *pAVar5;
  ASN1_VALUE *pAVar6;
  CONF_VALUE *cnf_00;
  size_t sVar7;
  stack_st_GENERAL_NAME *psVar8;
  
  sk = OPENSSL_sk_new_null();
  if (sk == (OPENSSL_STACK *)0x0) {
    sk = (OPENSSL_STACK *)0x0;
    GENERAL_NAME_free((GENERAL_NAME *)0x0);
    GENERAL_NAMES_free((GENERAL_NAMES *)0x0);
    OPENSSL_sk_pop_free_ex((OPENSSL_STACK *)0x0,sk_DIST_POINT_call_free_func,DIST_POINT_free);
  }
  else {
    sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)nval);
    if (sVar2 != 0) {
      sVar2 = 0;
      do {
        cnf = (CONF_VALUE *)OPENSSL_sk_value((OPENSSL_STACK *)nval,sVar2);
        if (cnf->value != (char *)0x0) {
          a = v2i_GENERAL_NAME((X509V3_EXT_METHOD *)method,(X509V3_CTX *)ctx,cnf);
          if (a == (GENERAL_NAME *)0x0) goto LAB_0048de99;
          pOVar3 = (OPENSSL_STACK *)GENERAL_NAMES_new();
          if (pOVar3 == (OPENSSL_STACK *)0x0) {
            pOVar3 = (OPENSSL_STACK *)0x0;
            goto LAB_0048de9e;
          }
          sVar4 = OPENSSL_sk_push(pOVar3,a);
          if (sVar4 == 0) goto LAB_0048de9e;
          pAVar5 = ASN1_item_new((ASN1_ITEM *)&DIST_POINT_it);
          if (pAVar5 != (ASN1_VALUE *)0x0) {
            sVar4 = OPENSSL_sk_push(sk,pAVar5);
            if (sVar4 == 0) goto LAB_0048de83;
            pAVar6 = ASN1_item_new((ASN1_ITEM *)&DIST_POINT_NAME_it);
            *(ASN1_VALUE **)pAVar5 = pAVar6;
            if (pAVar6 != (ASN1_VALUE *)0x0) {
              *(OPENSSL_STACK **)(pAVar6 + 8) = pOVar3;
              **(undefined4 **)pAVar5 = 0;
              goto LAB_0048de01;
            }
          }
LAB_0048de9c:
          a = (GENERAL_NAME *)0x0;
LAB_0048de9e:
          GENERAL_NAME_free(a);
          GENERAL_NAMES_free((GENERAL_NAMES *)pOVar3);
          OPENSSL_sk_pop_free_ex(sk,sk_DIST_POINT_call_free_func,DIST_POINT_free);
          return (void *)0x0;
        }
        pOVar3 = (OPENSSL_STACK *)X509V3_get_section((X509V3_CTX *)ctx,cnf->name);
        if (pOVar3 == (OPENSSL_STACK *)0x0) {
LAB_0048de99:
          pOVar3 = (OPENSSL_STACK *)0x0;
          goto LAB_0048de9c;
        }
        pAVar5 = ASN1_item_new((ASN1_ITEM *)&DIST_POINT_it);
        if (pAVar5 == (ASN1_VALUE *)0x0) {
          pOVar3 = (OPENSSL_STACK *)0x0;
          pAVar5 = (ASN1_VALUE *)0x0;
LAB_0048de83:
          ASN1_item_free(pAVar5,(ASN1_ITEM *)&DIST_POINT_it);
          goto LAB_0048de9c;
        }
        sVar4 = OPENSSL_sk_num(pOVar3);
        if (sVar4 != 0) {
          sVar4 = 0;
          do {
            cnf_00 = (CONF_VALUE *)OPENSSL_sk_value(pOVar3,sVar4);
            iVar1 = set_dist_point_name((DIST_POINT_NAME **)pAVar5,ctx,cnf_00);
            if (iVar1 < 1) {
              if (iVar1 < 0) {
LAB_0048de4c:
                ASN1_item_free(pAVar5,(ASN1_ITEM *)&DIST_POINT_it);
                pOVar3 = (OPENSSL_STACK *)0x0;
                a = (GENERAL_NAME *)0x0;
                goto LAB_0048de9e;
              }
              __s1 = cnf_00->name;
              iVar1 = strcmp(__s1,"reasons");
              if (iVar1 == 0) {
                iVar1 = set_reasons((ASN1_BIT_STRING **)(pAVar5 + 8),cnf_00->value);
                if (iVar1 == 0) goto LAB_0048de4c;
              }
              else {
                iVar1 = strcmp(__s1,"CRLissuer");
                if (iVar1 == 0) {
                  GENERAL_NAMES_free(*(GENERAL_NAMES **)(pAVar5 + 0x10));
                  psVar8 = gnames_from_sectname(ctx,cnf_00->value);
                  *(stack_st_GENERAL_NAME **)(pAVar5 + 0x10) = psVar8;
                  if (psVar8 == (stack_st_GENERAL_NAME *)0x0) goto LAB_0048de4c;
                }
              }
            }
            sVar4 = sVar4 + 1;
            sVar7 = OPENSSL_sk_num(pOVar3);
          } while (sVar4 < sVar7);
        }
        sVar4 = OPENSSL_sk_push(sk,pAVar5);
        if (sVar4 == 0) {
          ASN1_item_free(pAVar5,(ASN1_ITEM *)&DIST_POINT_it);
          goto LAB_0048de99;
        }
LAB_0048de01:
        sVar2 = sVar2 + 1;
        sVar4 = OPENSSL_sk_num((OPENSSL_STACK *)nval);
      } while (sVar2 < sVar4);
    }
  }
  return sk;
}

Assistant:

static void *v2i_crld(const X509V3_EXT_METHOD *method, const X509V3_CTX *ctx,
                      const STACK_OF(CONF_VALUE) *nval) {
  STACK_OF(DIST_POINT) *crld = NULL;
  GENERAL_NAMES *gens = NULL;
  GENERAL_NAME *gen = NULL;
  if (!(crld = sk_DIST_POINT_new_null())) {
    goto err;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    DIST_POINT *point;
    const CONF_VALUE *cnf = sk_CONF_VALUE_value(nval, i);
    if (!cnf->value) {
      const STACK_OF(CONF_VALUE) *dpsect = X509V3_get_section(ctx, cnf->name);
      if (!dpsect) {
        goto err;
      }
      point = crldp_from_section(ctx, dpsect);
      if (!point) {
        goto err;
      }
      if (!sk_DIST_POINT_push(crld, point)) {
        DIST_POINT_free(point);
        goto err;
      }
    } else {
      if (!(gen = v2i_GENERAL_NAME(method, ctx, cnf))) {
        goto err;
      }
      if (!(gens = GENERAL_NAMES_new())) {
        goto err;
      }
      if (!sk_GENERAL_NAME_push(gens, gen)) {
        goto err;
      }
      gen = NULL;
      if (!(point = DIST_POINT_new())) {
        goto err;
      }
      if (!sk_DIST_POINT_push(crld, point)) {
        DIST_POINT_free(point);
        goto err;
      }
      if (!(point->distpoint = DIST_POINT_NAME_new())) {
        goto err;
      }
      point->distpoint->name.fullname = gens;
      point->distpoint->type = 0;
      gens = NULL;
    }
  }
  return crld;

err:
  GENERAL_NAME_free(gen);
  GENERAL_NAMES_free(gens);
  sk_DIST_POINT_pop_free(crld, DIST_POINT_free);
  return NULL;
}